

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

void __thiscall
TTD::SlabAllocatorBase<0>::CopyStringIntoWLength
          (SlabAllocatorBase<0> *this,char16 *str,uint32 length,TTString *into)

{
  char16_t *dst;
  
  if (str != (char16 *)0x0) {
    into->Length = length;
    dst = SlabAllocateArray<char16_t>(this,(ulong)(length + 1));
    into->Contents = dst;
    js_memcpy_s(dst,(ulong)into->Length * 2,str,(ulong)length * 2);
    into->Contents[into->Length] = L'\0';
    return;
  }
  TTDAbort_unrecoverable_error("Not allowed for string + length");
}

Assistant:

void CopyStringIntoWLength(const char16* str, uint32 length, TTString& into)
        {
            TTDAssert(str != nullptr, "Not allowed for string + length");

            into.Length = length;
            into.Contents = this->SlabAllocateArray<char16>(into.Length + 1);

            //don't js_memcpy if the contents length is 0
            js_memcpy_s(into.Contents, into.Length * sizeof(char16), str, length * sizeof(char16));
            into.Contents[into.Length] = '\0';
        }